

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3FkActions(Parse *pParse,Table *pTab,ExprList *pChanges,int regOld,int *aChange,
                     int bChngRowid)

{
  sColMap *psVar1;
  u64 n;
  u8 uVar2;
  char cVar3;
  u8 uVar4;
  sqlite3 *db;
  undefined1 uVar5;
  int iVar6;
  HashElem *pHVar7;
  sColMap *psVar8;
  Expr *pEVar9;
  Expr *pEVar10;
  Expr *pRight;
  char *pcVar11;
  ExprList *pEList;
  SrcList *pSrc;
  Schema *pSVar12;
  Select *pSVar13;
  FKey *p;
  Trigger *p_00;
  uint uVar14;
  long lVar15;
  uint h;
  int *aiCol;
  Token tNew;
  Index *pIdx;
  Token tToCol;
  Token tFromCol;
  Expr *local_108;
  Select *local_e8;
  ExprList *local_e0;
  Expr *local_d8;
  Token local_c8;
  char *local_b0;
  int *local_a8;
  int local_9c;
  Token local_98;
  TriggerStep *local_80;
  ulong local_78;
  int *local_70;
  Index *local_68;
  ulong local_60;
  FKey *local_58;
  Token local_50;
  Token local_40;
  
  if ((pParse->db->flags & 0x80000) != 0) {
    local_9c = regOld;
    local_70 = aChange;
    pHVar7 = findElementWithHash(&pTab->pSchema->fkeyHash,pTab->zName,(uint *)&local_c8);
    if (pHVar7 == (HashElem *)0x0) {
      p = (FKey *)0x0;
    }
    else {
      p = (FKey *)pHVar7->data;
    }
    if (p != (FKey *)0x0) {
      local_78 = (ulong)(pChanges != (ExprList *)0x0);
      do {
        if ((local_70 == (int *)0x0) ||
           (iVar6 = fkParentIsModified(pTab,p,local_70,bChngRowid), iVar6 != 0)) {
          uVar2 = p->aAction[local_78];
          p_00 = p->apTrigger[local_78];
          if (p_00 == (Trigger *)0x0 && uVar2 != '\0') {
            db = pParse->db;
            local_68 = (Index *)0x0;
            local_a8 = (int *)0x0;
            iVar6 = sqlite3FkLocateIndex(pParse,pTab,p,&local_68,&local_a8);
            p_00 = (Trigger *)0x0;
            if (iVar6 == 0) {
              if (p->nCol < 1) {
                local_108 = (Expr *)0x0;
                local_e0 = (ExprList *)0x0;
                local_d8 = (Expr *)0x0;
              }
              else {
                psVar1 = p->aCol;
                local_b0 = (char *)CONCAT71(local_b0._1_7_,
                                            (uVar2 != '\t' || pChanges != (ExprList *)0x0) &&
                                            uVar2 != '\x06');
                lVar15 = 0;
                local_d8 = (Expr *)0x0;
                local_e0 = (ExprList *)0x0;
                local_108 = (Expr *)0x0;
                local_58 = p;
                do {
                  local_c8.z = "old";
                  local_c8.n = 3;
                  local_c8._12_4_ = 0;
                  psVar8 = (sColMap *)(local_a8 + lVar15);
                  if (local_a8 == (int *)0x0) {
                    psVar8 = psVar1;
                  }
                  local_98.z = "new";
                  local_98.n = 3;
                  local_98._12_4_ = 0;
                  local_50.z = "oid";
                  if (local_68 != (Index *)0x0) {
                    local_50.z = pTab->aCol[local_68->aiColumn[lVar15]].zName;
                  }
                  iVar6 = psVar8->iFrom;
                  local_40.z = p->pFrom->aCol[iVar6].zName;
                  local_40.n = 0;
                  local_50.n = 0;
                  if (local_50.z != (char *)0x0) {
                    local_50.n = 0xffffffff;
                    pcVar11 = local_50.z;
                    do {
                      local_50.n = local_50.n + 1;
                      cVar3 = *pcVar11;
                      pcVar11 = pcVar11 + 1;
                    } while (cVar3 != '\0');
                    local_50.n = local_50.n & 0x3fffffff;
                  }
                  if (local_40.z != (char *)0x0) {
                    local_40.n = 0xffffffff;
                    pcVar11 = local_40.z;
                    do {
                      local_40.n = local_40.n + 1;
                      cVar3 = *pcVar11;
                      pcVar11 = pcVar11 + 1;
                    } while (cVar3 != '\0');
                    local_40.n = local_40.n & 0x3fffffff;
                  }
                  pEVar9 = sqlite3PExpr(pParse,0x1b,(Expr *)0x0,(Expr *)0x0,&local_c8);
                  pEVar10 = sqlite3PExpr(pParse,0x1b,(Expr *)0x0,(Expr *)0x0,&local_50);
                  pEVar9 = sqlite3PExpr(pParse,0x7a,pEVar9,pEVar10,(Token *)0x0);
                  pEVar10 = sqlite3PExpr(pParse,0x1b,(Expr *)0x0,(Expr *)0x0,&local_40);
                  pEVar9 = sqlite3PExpr(pParse,0x4f,pEVar9,pEVar10,(Token *)0x0);
                  local_108 = sqlite3ExprAnd(db,local_108,pEVar9);
                  if (pChanges != (ExprList *)0x0) {
                    pEVar9 = sqlite3PExpr(pParse,0x1b,(Expr *)0x0,(Expr *)0x0,&local_c8);
                    pEVar10 = sqlite3PExpr(pParse,0x1b,(Expr *)0x0,(Expr *)0x0,&local_50);
                    pEVar9 = sqlite3PExpr(pParse,0x7a,pEVar9,pEVar10,(Token *)0x0);
                    pEVar10 = sqlite3PExpr(pParse,0x1b,(Expr *)0x0,(Expr *)0x0,&local_98);
                    pRight = sqlite3PExpr(pParse,0x1b,(Expr *)0x0,(Expr *)0x0,&local_50);
                    pEVar10 = sqlite3PExpr(pParse,0x7a,pEVar10,pRight,(Token *)0x0);
                    pEVar9 = sqlite3PExpr(pParse,0x49,pEVar9,pEVar10,(Token *)0x0);
                    local_d8 = sqlite3ExprAnd(db,local_d8,pEVar9);
                  }
                  p = local_58;
                  if ((char)local_b0 != '\0') {
                    if (uVar2 == '\b') {
                      pEVar9 = local_58->pFrom->aCol[iVar6].pDflt;
                      if (pEVar9 == (Expr *)0x0) goto LAB_0016aae0;
                      pEVar9 = exprDup(db,pEVar9,0,(u8 **)0x0);
                    }
                    else {
                      if (uVar2 == '\t') {
                        pEVar9 = sqlite3PExpr(pParse,0x1b,(Expr *)0x0,(Expr *)0x0,&local_98);
                        pEVar10 = sqlite3PExpr(pParse,0x1b,(Expr *)0x0,(Expr *)0x0,&local_50);
                        iVar6 = 0x7a;
                      }
                      else {
LAB_0016aae0:
                        iVar6 = 0x65;
                        pEVar9 = (Expr *)0x0;
                        pEVar10 = (Expr *)0x0;
                      }
                      pEVar9 = sqlite3PExpr(pParse,iVar6,pEVar9,pEVar10,(Token *)0x0);
                    }
                    local_e0 = sqlite3ExprListAppend(pParse,local_e0,pEVar9);
                    sqlite3ExprListSetName(pParse,local_e0,&local_40,0);
                  }
                  lVar15 = lVar15 + 1;
                } while (lVar15 < p->nCol);
              }
              sqlite3DbFree(db,local_a8);
              local_b0 = p->pFrom->zName;
              if (local_b0 == (char *)0x0) {
                uVar14 = 0;
              }
              else {
                uVar14 = 0xffffffff;
                pcVar11 = local_b0;
                do {
                  uVar14 = uVar14 + 1;
                  cVar3 = *pcVar11;
                  pcVar11 = pcVar11 + 1;
                } while (cVar3 != '\0');
                uVar14 = uVar14 & 0x3fffffff;
              }
              if (uVar2 == '\x06') {
                local_98.n = uVar14;
                local_c8.z = "FOREIGN KEY constraint failed";
                local_c8.n = 0x1d;
                local_98.z = local_b0;
                pEVar9 = sqlite3ExprAlloc(db,0x39,&local_c8,0);
                if (pEVar9 != (Expr *)0x0) {
                  pEVar9->affinity = '\x02';
                }
                pEList = sqlite3ExprListAppend(pParse,(ExprList *)0x0,pEVar9);
                pSrc = sqlite3SrcListAppend(db,(SrcList *)0x0,&local_98,(Token *)0x0);
                local_e8 = sqlite3SelectNew(pParse,pEList,pSrc,local_108,(ExprList *)0x0,(Expr *)0x0
                                            ,(ExprList *)0x0,0,(Expr *)0x0,(Expr *)0x0);
                local_108 = (Expr *)0x0;
              }
              else {
                local_e8 = (Select *)0x0;
              }
              uVar4 = (db->lookaside).bEnabled;
              (db->lookaside).bEnabled = '\0';
              local_60 = (ulong)uVar14;
              n = local_60 + 0x99;
              p_00 = (Trigger *)sqlite3DbMallocRaw(db,n);
              if (p_00 == (Trigger *)0x0) {
                local_80 = (TriggerStep *)0x0;
              }
              else {
                memset(p_00,0,n);
                local_80 = (TriggerStep *)(p_00 + 1);
                p_00->step_list = local_80;
                p_00[1].pWhen = (Expr *)&p_00[2].table;
                *(uint *)&p_00[1].pColumns = uVar14;
                memcpy(&p_00[2].table,local_b0,local_60);
                pSVar12 = (Schema *)exprDup(db,local_108,1,(u8 **)0x0);
                p_00[1].pSchema = pSVar12;
                pSVar12 = (Schema *)sqlite3ExprListDup(db,local_e0,1);
                p_00[1].pTabSchema = pSVar12;
                pSVar13 = sqlite3SelectDup(db,local_e8,1);
                *(Select **)&p_00[1].op = pSVar13;
                if (local_d8 == (Expr *)0x0) {
                  local_d8 = (Expr *)0x0;
                }
                else {
                  local_d8 = sqlite3PExpr(pParse,0x13,local_d8,(Expr *)0x0,(Token *)0x0);
                  pEVar9 = exprDup(db,local_d8,1,(u8 **)0x0);
                  p_00->pWhen = pEVar9;
                }
              }
              (db->lookaside).bEnabled = uVar4;
              sqlite3ExprDelete(db,local_108);
              sqlite3ExprDelete(db,local_d8);
              sqlite3ExprListDelete(db,local_e0);
              clearSelect(db,local_e8,1);
              if (db->mallocFailed == '\x01') {
                fkTriggerDelete(db,p_00);
                p_00 = (Trigger *)0x0;
              }
              else {
                if (uVar2 == '\x06') {
                  uVar5 = 0x77;
                }
                else if ((uVar2 == '\t') && (pChanges == (ExprList *)0x0)) {
                  uVar5 = 0x6d;
                }
                else {
                  uVar5 = 0x6e;
                }
                local_80->op = uVar5;
                local_80->pTrig = p_00;
                pSVar12 = pTab->pSchema;
                p_00->pSchema = pSVar12;
                p_00->pTabSchema = pSVar12;
                p->apTrigger[local_78] = p_00;
                p_00->op = (pChanges != (ExprList *)0x0) + 'm';
              }
            }
          }
          if (p_00 != (Trigger *)0x0) {
            sqlite3CodeRowTriggerDirect(pParse,p_00,pTab,local_9c,2,0);
          }
        }
        p = p->pNextTo;
      } while (p != (FKey *)0x0);
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3FkActions(
  Parse *pParse,                  /* Parse context */
  Table *pTab,                    /* Table being updated or deleted from */
  ExprList *pChanges,             /* Change-list for UPDATE, NULL for DELETE */
  int regOld,                     /* Address of array containing old row */
  int *aChange,                   /* Array indicating UPDATEd columns (or 0) */
  int bChngRowid                  /* True if rowid is UPDATEd */
){
  /* If foreign-key support is enabled, iterate through all FKs that 
  ** refer to table pTab. If there is an action associated with the FK 
  ** for this operation (either update or delete), invoke the associated 
  ** trigger sub-program.  */
  if( pParse->db->flags&SQLITE_ForeignKeys ){
    FKey *pFKey;                  /* Iterator variable */
    for(pFKey = sqlite3FkReferences(pTab); pFKey; pFKey=pFKey->pNextTo){
      if( aChange==0 || fkParentIsModified(pTab, pFKey, aChange, bChngRowid) ){
        Trigger *pAct = fkActionTrigger(pParse, pTab, pFKey, pChanges);
        if( pAct ){
          sqlite3CodeRowTriggerDirect(pParse, pAct, pTab, regOld, OE_Abort, 0);
        }
      }
    }
  }
}